

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::internal::bigint::remove_leading_zeros(bigint *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint *puVar5;
  
  uVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar1 = 1;
  if ((int)uVar3 < 1) {
    iVar1 = (int)uVar3;
  }
  puVar5 = (this->bigits_).super_buffer<unsigned_int>.ptr_ + (uVar3 & 0xffffffff);
  do {
    puVar5 = puVar5 + -1;
    iVar2 = (int)uVar3;
    iVar4 = iVar1;
    if (iVar2 < 2) break;
    uVar3 = (ulong)(iVar2 - 1);
    iVar4 = iVar2;
  } while (*puVar5 == 0);
  buffer<unsigned_int>::resize((buffer<unsigned_int> *)this,(long)iVar4);
  return;
}

Assistant:

void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(num_bigits + 1);
  }